

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O1

Error __thiscall
llvm::object::ObjectFile::printSymbolName(ObjectFile *this,raw_ostream *OS,DataRefImpl Symb)

{
  StringRef Str;
  long *plVar1;
  _func_int **pp_Var2;
  long *local_38;
  Expected<llvm::StringRef> Name;
  byte local_28;
  
  (*OS->_vptr_raw_ostream[8])(&local_38);
  plVar1 = local_38;
  if ((local_28 & 1) == 0) {
    pp_Var2 = (_func_int **)0x1;
    Str.Length = _Name;
    Str.Data = (char *)local_38;
    raw_ostream::operator<<((raw_ostream *)Symb,Str);
  }
  else {
    local_38 = (long *)0x0;
    pp_Var2 = (_func_int **)((ulong)plVar1 | 1);
  }
  (this->super_SymbolicFile).super_Binary._vptr_Binary = pp_Var2;
  if (((local_28 & 1) != 0) && (local_38 != (long *)0x0)) {
    (**(code **)(*local_38 + 8))();
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error ObjectFile::printSymbolName(raw_ostream &OS, DataRefImpl Symb) const {
  Expected<StringRef> Name = getSymbolName(Symb);
  if (!Name)
    return Name.takeError();
  OS << *Name;
  return Error::success();
}